

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall kj::Canceler::release(Canceler *this)

{
  AdapterBase *pAVar1;
  Maybe<kj::Canceler::AdapterBase_&> *pMVar2;
  AdapterBase *pAVar3;
  Maybe<kj::Canceler::AdapterBase_&> *p;
  AdapterBase *_n261;
  
  pAVar1 = (this->list).ptr;
  while (pAVar1 != (AdapterBase *)0x0) {
    pMVar2 = (pAVar1->prev).ptr;
    pAVar3 = (pAVar1->next).ptr;
    if (pMVar2 != (Maybe<kj::Canceler::AdapterBase_&> *)0x0) {
      pMVar2->ptr = pAVar3;
    }
    if (pAVar3 != (AdapterBase *)0x0) {
      (pAVar3->prev).ptr = pMVar2;
    }
    (pAVar1->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
    (pAVar1->next).ptr = (AdapterBase *)0x0;
    pAVar1 = (this->list).ptr;
  }
  return;
}

Assistant:

inline T* readMaybe(const Maybe<T&>& maybe) { return maybe.ptr; }